

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContinuumMaterial.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChContinuumElastic::ChContinuumElastic
          (ChContinuumElastic *this,double myoung,double mpoisson,double mdensity)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar3 [64];
  
  auVar3._8_56_ = in_register_00001248;
  auVar3._0_8_ = mpoisson;
  (this->super_ChContinuumMaterial).density = mdensity;
  (this->super_ChContinuumMaterial)._vptr_ChContinuumMaterial =
       (_func_int **)&PTR__ChContinuumElastic_00b4ea98;
  (this->StressStrainMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
  m_storage.m_data = (double *)0x0;
  (this->StressStrainMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
  m_storage.m_rows = 0;
  (this->StressStrainMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
  m_storage.m_cols = 0;
  this->E = myoung;
  this->v = mpoisson;
  dVar1 = mpoisson + 1.0;
  this->G = myoung / (dVar1 + dVar1);
  auVar2 = vfmadd231sd_fma(ZEXT816(0x3ff0000000000000),auVar3._0_16_,ZEXT816(0xc000000000000000));
  this->l = (myoung * mpoisson) / (dVar1 * auVar2._0_8_);
  ComputeStressStrainMatrix(this);
  ComputeStressStrainMatrix(this);
  this->damping_M = 0.0;
  this->damping_K = 0.0;
  return;
}

Assistant:

ChContinuumElastic::ChContinuumElastic(double myoung, double mpoisson, double mdensity)
    : ChContinuumMaterial(mdensity) {
    E = myoung;
    Set_v(mpoisson);              // sets also G and l
    ComputeStressStrainMatrix();  // sets Elasticity matrix
    this->damping_M = 0;
    this->damping_K = 0;
}